

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void FFSClearTimestepData(SstStream Stream)

{
  int *piVar1;
  long in_RDI;
  int i;
  FFSReaderMarshalBase *Info;
  int local_14;
  
  piVar1 = *(int **)(in_RDI + 0x300);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x238); local_14 = local_14 + 1) {
    if (*(long *)(*(long *)(piVar1 + 0x10) + (long)local_14 * 0x18 + 8) != 0) {
      free(*(void **)(*(long *)(piVar1 + 0x10) + (long)local_14 * 0x18 + 8));
    }
  }
  memset(*(void **)(piVar1 + 0x10),0,(long)*(int *)(in_RDI + 0x238) * 0x18);
  memset(*(void **)(piVar1 + 8),0,(long)*(int *)(in_RDI + 0x238) << 3);
  memset(*(void **)(piVar1 + 10),0,(long)*(int *)(in_RDI + 0x238) << 3);
  memset(*(void **)(piVar1 + 0xc),0,(long)*(int *)(in_RDI + 0x238) << 3);
  memset(*(void **)(piVar1 + 0xe),0,(long)*(int *)(in_RDI + 0x238) << 3);
  for (local_14 = 0; local_14 < *piVar1; local_14 = local_14 + 1) {
    **(undefined8 **)(*(long *)(piVar1 + 2) + (long)local_14 * 8) = 0;
  }
  return;
}

Assistant:

extern void FFSClearTimestepData(SstStream Stream)
{

    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int i;
    for (i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Info->WriterInfo[i].RawBuffer)
            free(Info->WriterInfo[i].RawBuffer);
    }
    memset(Info->WriterInfo, 0, sizeof(Info->WriterInfo[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataBaseAddrs, 0,
           sizeof(Info->MetadataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->MetadataFieldLists, 0,
           sizeof(Info->MetadataFieldLists[0]) * Stream->WriterCohortSize);
    memset(Info->DataBaseAddrs, 0, sizeof(Info->DataBaseAddrs[0]) * Stream->WriterCohortSize);
    memset(Info->DataFieldLists, 0, sizeof(Info->DataFieldLists[0]) * Stream->WriterCohortSize);
    for (i = 0; i < Info->VarCount; i++)
    {
        Info->VarList[i]->Variable = NULL;
    }
}